

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTreeNode.cpp
# Opt level: O3

AVLTreeNode<short> * __thiscall itis::AVLTreeNode<short>::right_rotate(AVLTreeNode<short> *this)

{
  AVLTreeNode<short> *this_00;
  
  this_00 = this->left;
  this->left = this_00->right;
  this_00->right = this;
  updateValues(this);
  updateValues(this_00);
  return this_00;
}

Assistant:

AVLTreeNode<T>* AVLTreeNode<T>::right_rotate() {
    AVLTreeNode* L = left;
    left = left->right;
    L->right = this;

    this->updateValues();  // the order is important
    L->updateValues();

    return L;
  }